

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O2

ControlInfo * __thiscall
adios2::format::BP5Deserializer::GetPriorControl(BP5Deserializer *this,FMFormat Format)

{
  ControlInfo *pCVar1;
  ControlInfo **ppCVar2;
  
  ppCVar2 = &this->ControlBlocks;
  while( true ) {
    pCVar1 = *ppCVar2;
    if ((pCVar1 == (ControlInfo *)0x0) || (pCVar1->Format == Format)) break;
    ppCVar2 = &pCVar1->Next;
  }
  return pCVar1;
}

Assistant:

BP5Deserializer::ControlInfo *BP5Deserializer::GetPriorControl(FMFormat Format)
{
    struct ControlInfo *tmp = ControlBlocks;
    while (tmp)
    {
        if (tmp->Format == Format)
        {
            return tmp;
        }
        tmp = tmp->Next;
    }
    return NULL;
}